

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 countLookasideSlots(LookasideSlot *p)

{
  u32 cnt;
  LookasideSlot *p_local;
  
  cnt = 0;
  for (p_local = p; p_local != (LookasideSlot *)0x0; p_local = p_local->pNext) {
    cnt = cnt + 1;
  }
  return cnt;
}

Assistant:

static u32 countLookasideSlots(LookasideSlot *p){
  u32 cnt = 0;
  while( p ){
    p = p->pNext;
    cnt++;
  }
  return cnt;
}